

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_rowcol
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  parasail_result_t *ppVar12;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  ulong size;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  int NWL;
  int NWS;
  int NWM;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  uint local_e4;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_stats_rowcol_cold_8();
  }
  else {
    size = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sg_flags_stats_rowcol_cold_7();
    }
    else if (open < 0) {
      parasail_sg_flags_stats_rowcol_cold_6();
    }
    else if (gap < 0) {
      parasail_sg_flags_stats_rowcol_cold_5();
    }
    else {
      uVar13 = (ulong)(uint)_s1Len;
      if (matrix == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_rowcol_cold_4();
      }
      else {
        if (matrix->type == 1) {
          if (_s1 == (char *)0x0) {
            parasail_sg_flags_stats_rowcol_cold_3();
            return (parasail_result_t *)0x0;
          }
        }
        else {
          if (_s1 == (char *)0x0) {
            parasail_sg_flags_stats_rowcol_cold_2();
            return (parasail_result_t *)0x0;
          }
          if (_s1Len < 1) {
            parasail_sg_flags_stats_rowcol_cold_1();
            return (parasail_result_t *)0x0;
          }
        }
        if (matrix->type != 0) {
          uVar13 = (ulong)(uint)matrix->length;
        }
        iVar17 = (int)uVar13;
        ppVar12 = parasail_result_new_rowcol3(iVar17,s2Len);
        if (ppVar12 != (parasail_result_t *)0x0) {
          ppVar12->flag =
               (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
               (uint)(s2_end != 0) << 0xf | ppVar12->flag | 0x1450102;
          ptr = parasail_memalign_int(0x10,(long)iVar17);
          ptr_00 = parasail_memalign_int(0x10,size);
          uVar18 = (ulong)(s2Len + 1);
          ptr_01 = parasail_memalign_int(0x10,uVar18);
          ptr_02 = parasail_memalign_int(0x10,uVar18);
          ptr_03 = parasail_memalign_int(0x10,uVar18);
          ptr_04 = parasail_memalign_int(0x10,uVar18);
          ptr_05 = parasail_memalign_int(0x10,uVar18);
          ptr_06 = parasail_memalign_int(0x10,uVar18);
          ptr_07 = parasail_memalign_int(0x10,uVar18);
          ptr_08 = parasail_memalign_int(0x10,uVar18);
          if ((ptr_08 != (int *)0x0 && (ptr_07 != (int *)0x0 && ptr_06 != (int *)0x0)) &&
              ((ptr_05 != (int *)0x0 && (ptr_04 != (int *)0x0 && ptr_03 != (int *)0x0)) &&
              ((ptr_02 != (int *)0x0 && ptr_01 != (int *)0x0) &&
              (ptr_00 != (int *)0x0 && ptr != (int *)0x0)))) {
            if (0 < iVar17) {
              piVar6 = matrix->mapper;
              uVar18 = 0;
              do {
                ptr[uVar18] = piVar6[(byte)_s1[uVar18]];
                uVar18 = uVar18 + 1;
              } while (uVar13 != uVar18);
            }
            iVar9 = iVar17 + -1;
            iVar10 = s2Len + -1;
            piVar6 = matrix->mapper;
            uVar13 = 1;
            if (1 < s2Len) {
              uVar13 = size;
            }
            uVar18 = 0;
            do {
              ptr_00[uVar18] = piVar6[(byte)_s2[uVar18]];
              uVar18 = uVar18 + 1;
            } while (uVar13 != uVar18);
            *ptr_01 = 0;
            *ptr_02 = 0;
            *ptr_03 = 0;
            *ptr_04 = 0;
            *ptr_05 = -0x40000000;
            *ptr_06 = 0;
            *ptr_07 = 0;
            *ptr_08 = 0;
            if (s2_beg == 0) {
              iVar15 = -open;
              lVar19 = 0;
              do {
                *(int *)((long)ptr_01 + lVar19 + 4) = iVar15;
                *(undefined4 *)((long)ptr_02 + lVar19 + 4) = 0;
                *(undefined4 *)((long)ptr_03 + lVar19 + 4) = 0;
                *(undefined4 *)((long)ptr_04 + lVar19 + 4) = 0;
                *(undefined4 *)((long)ptr_05 + lVar19 + 4) = 0xc0000000;
                *(undefined4 *)((long)ptr_06 + lVar19 + 4) = 0;
                *(undefined4 *)((long)ptr_07 + lVar19 + 4) = 0;
                *(undefined4 *)((long)ptr_08 + lVar19 + 4) = 0;
                iVar15 = iVar15 - gap;
                lVar19 = lVar19 + 4;
              } while (uVar13 * 4 != lVar19);
            }
            else {
              lVar19 = 0;
              do {
                *(undefined4 *)((long)ptr_01 + lVar19 + 4) = 0;
                *(undefined4 *)((long)ptr_02 + lVar19 + 4) = 0;
                *(undefined4 *)((long)ptr_03 + lVar19 + 4) = 0;
                *(undefined4 *)((long)ptr_04 + lVar19 + 4) = 0;
                *(undefined4 *)((long)ptr_05 + lVar19 + 4) = 0xc0000000;
                *(undefined4 *)((long)ptr_06 + lVar19 + 4) = 0;
                *(undefined4 *)((long)ptr_07 + lVar19 + 4) = 0;
                *(undefined4 *)((long)ptr_08 + lVar19 + 4) = 0;
                lVar19 = lVar19 + 4;
              } while (uVar13 * 4 != lVar19);
            }
            local_114 = iVar9;
            if (iVar17 < 1) {
              local_e4 = 0xc0000000;
              local_108 = -0x40000000;
              local_110 = -0x40000000;
              local_10c = -0x40000000;
            }
            else {
              uVar13 = 1;
              if (1 < s2Len) {
                uVar13 = size;
              }
              local_10c = -0x40000000;
              uVar18 = 1;
              local_110 = -0x40000000;
              local_108 = -0x40000000;
              local_e4 = 0xc0000000;
              do {
                if (matrix->type == 0) {
                  iVar15 = matrix->size;
                  lVar19 = (long)ptr[uVar18 - 1];
                }
                else {
                  iVar15 = matrix->size;
                  lVar19 = uVar18 - 1;
                }
                piVar6 = matrix->matrix;
                uVar23 = 0;
                iVar30 = *ptr_01;
                iVar32 = *ptr_02;
                iVar25 = *ptr_03;
                uVar24 = (ulong)(uint)((1 - (int)uVar18) * gap - open);
                if (s1_beg != 0) {
                  uVar24 = uVar23;
                }
                iVar1 = *ptr_04;
                *ptr_01 = (int)uVar24;
                *ptr_02 = 0;
                *ptr_03 = 0;
                *ptr_04 = 0;
                uVar33 = 0xc0000000;
                iVar11 = 0;
                iVar20 = 0;
                iVar28 = 0;
                iVar31 = 0;
                iVar14 = 0;
                iVar26 = 0;
                do {
                  iVar2 = *(int *)((long)ptr_01 + uVar23 + 4);
                  iVar3 = *(int *)((long)ptr_02 + uVar23 + 4);
                  iVar4 = *(int *)((long)ptr_03 + uVar23 + 4);
                  uVar29 = iVar2 - open;
                  uVar27 = *(int *)((long)ptr_05 + uVar23 + 4) - gap;
                  uVar7 = uVar27;
                  if ((int)uVar27 < (int)uVar29) {
                    uVar7 = uVar29;
                  }
                  iVar5 = *(int *)((long)ptr_04 + uVar23 + 4);
                  *(uint *)((long)ptr_05 + uVar23 + 4) = uVar7;
                  uVar16 = (int)uVar24 - open;
                  uVar22 = uVar33 - gap;
                  uVar33 = uVar16;
                  if ((int)uVar16 <= (int)uVar22) {
                    uVar33 = uVar22;
                  }
                  uVar21 = iVar30 + piVar6[lVar19 * iVar15 + (long)*(int *)((long)ptr_00 + uVar23)];
                  uVar8 = uVar33;
                  if ((int)uVar33 < (int)uVar21) {
                    uVar8 = uVar21;
                  }
                  if ((int)uVar8 <= (int)uVar7) {
                    uVar8 = uVar7;
                  }
                  uVar24 = (ulong)uVar8;
                  if ((int)uVar27 < (int)uVar29) {
                    *(int *)((long)ptr_06 + uVar23 + 4) = iVar3;
                    *(int *)((long)ptr_07 + uVar23 + 4) = iVar4;
                    *(int *)((long)ptr_08 + uVar23 + 4) = iVar5;
                  }
                  iVar30 = *(int *)((long)ptr_08 + uVar23 + 4) + 1;
                  *(int *)((long)ptr_08 + uVar23 + 4) = iVar30;
                  if ((int)uVar16 <= (int)uVar22) {
                    iVar14 = iVar20;
                    iVar26 = iVar28;
                    iVar31 = iVar11;
                  }
                  iVar28 = iVar26;
                  iVar20 = iVar14;
                  iVar11 = iVar31 + 1;
                  if (uVar8 == uVar21) {
                    iVar26 = iVar32 + (uint)(ptr[uVar18 - 1] == *(int *)((long)ptr_00 + uVar23));
                    iVar14 = iVar25 + (uint)(0 < piVar6[lVar19 * iVar15 +
                                                        (long)*(int *)((long)ptr_00 + uVar23)]);
                    iVar31 = iVar1 + 1;
                  }
                  else {
                    iVar26 = iVar28;
                    iVar14 = iVar20;
                    iVar31 = iVar11;
                    if (uVar8 == *(uint *)((long)ptr_05 + uVar23 + 4)) {
                      iVar26 = *(int *)((long)ptr_06 + uVar23 + 4);
                      iVar14 = *(int *)((long)ptr_07 + uVar23 + 4);
                      iVar31 = iVar30;
                    }
                  }
                  *(uint *)((long)ptr_01 + uVar23 + 4) = uVar8;
                  *(int *)((long)ptr_02 + uVar23 + 4) = iVar26;
                  *(int *)((long)ptr_03 + uVar23 + 4) = iVar14;
                  *(int *)((long)ptr_04 + uVar23 + 4) = iVar31;
                  uVar23 = uVar23 + 4;
                  iVar30 = iVar2;
                  iVar32 = iVar3;
                  iVar25 = iVar4;
                  iVar1 = iVar5;
                } while (uVar13 << 2 != uVar23);
                if ((s1_end != 0) && ((int)local_e4 < (int)uVar8)) {
                  local_114 = (int)uVar18 + -1;
                  local_110 = iVar14;
                  local_10c = iVar31;
                  local_108 = iVar26;
                  local_e4 = uVar8;
                }
                *(uint *)(*(long *)((long)((ppVar12->field_4).trace)->trace_del_table + 0x20) + -4 +
                         uVar18 * 4) = uVar8;
                *(int *)(*(long *)((long)((ppVar12->field_4).trace)->trace_del_table + 0x28) + -4 +
                        uVar18 * 4) = iVar26;
                *(int *)(*(long *)((long)((ppVar12->field_4).trace)->trace_del_table + 0x30) + -4 +
                        uVar18 * 4) = iVar14;
                *(int *)(*(long *)((long)((ppVar12->field_4).trace)->trace_del_table + 0x38) + -4 +
                        uVar18 * 4) = iVar31;
                uVar18 = uVar18 + 1;
              } while (uVar18 != iVar17 + 1);
            }
            iVar17 = iVar10;
            if (s1_end == 0 || s2_end == 0) {
              if (s2_end != 0) {
                uVar13 = 1;
                if (1 < s2Len) {
                  uVar13 = size;
                }
                uVar18 = 0;
                do {
                  if ((int)local_e4 < ptr_01[uVar18 + 1]) {
                    local_108 = ptr_02[uVar18 + 1];
                    local_110 = ptr_03[uVar18 + 1];
                    local_10c = ptr_04[uVar18 + 1];
                    iVar17 = (int)uVar18;
                    local_e4 = ptr_01[uVar18 + 1];
                    local_114 = iVar9;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar13 != uVar18);
              }
            }
            else {
              uVar13 = 1;
              if (1 < s2Len) {
                uVar13 = size;
              }
              iVar15 = 1;
              uVar18 = 0;
              do {
                uVar24 = uVar18 + 1;
                uVar33 = ptr_01[uVar18 + 1];
                if ((int)local_e4 < (int)uVar33) {
                  local_108 = ptr_02[uVar18 + 1];
                  local_110 = ptr_03[uVar18 + 1];
                  local_10c = ptr_04[uVar18 + 1];
                  iVar17 = (int)uVar18;
                  local_e4 = uVar33;
                  local_114 = iVar9;
                }
                else if ((uVar33 == local_e4) && ((long)uVar24 <= (long)iVar17)) {
                  iVar17 = iVar15 + -1;
                  local_108 = ptr_02[uVar18 + 1];
                  local_110 = ptr_03[uVar18 + 1];
                  local_10c = ptr_04[uVar18 + 1];
                  local_114 = iVar9;
                }
                iVar15 = iVar15 + 1;
                uVar18 = uVar24;
              } while (uVar13 != uVar24);
            }
            if (s2_end == 0 && s1_end == 0) {
              local_e4 = ptr_01[size];
              local_108 = ptr_02[size];
              local_110 = ptr_03[size];
              local_10c = ptr_04[size];
              iVar17 = iVar10;
              local_114 = iVar9;
            }
            uVar13 = 1;
            if (1 < s2Len) {
              uVar13 = size;
            }
            lVar19 = 0;
            do {
              *(undefined4 *)(*((ppVar12->field_4).trace)->trace_del_table + lVar19) =
                   *(undefined4 *)((long)ptr_01 + lVar19 + 4);
              *(undefined4 *)
               (*(long *)((long)((ppVar12->field_4).trace)->trace_del_table + 8) + lVar19) =
                   *(undefined4 *)((long)ptr_02 + lVar19 + 4);
              *(undefined4 *)
               (*(long *)((long)((ppVar12->field_4).trace)->trace_del_table + 0x10) + lVar19) =
                   *(undefined4 *)((long)ptr_03 + lVar19 + 4);
              *(undefined4 *)
               (*(long *)((long)((ppVar12->field_4).trace)->trace_del_table + 0x18) + lVar19) =
                   *(undefined4 *)((long)ptr_04 + lVar19 + 4);
              lVar19 = lVar19 + 4;
            } while (uVar13 * 4 != lVar19);
            ppVar12->score = local_e4;
            ppVar12->end_query = local_114;
            ppVar12->end_ref = iVar17;
            ((ppVar12->field_4).stats)->matches = local_108;
            ((ppVar12->field_4).stats)->similar = local_110;
            ((ppVar12->field_4).stats)->length = local_10c;
            parasail_free(ptr_08);
            parasail_free(ptr_07);
            parasail_free(ptr_06);
            parasail_free(ptr_05);
            parasail_free(ptr_04);
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            return ppVar12;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict HM = NULL;
    int * restrict HS = NULL;
    int * restrict HL = NULL;
    int * restrict F = NULL;
    int * restrict FM = NULL;
    int * restrict FS = NULL;
    int * restrict FL = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = NEG_INF_32;
    similar = NEG_INF_32;
    length = NEG_INF_32;
    end_query = s1Len-1;
    end_ref = s2Len-1;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    HM = parasail_memalign_int(16, s2Len+1);
    HS = parasail_memalign_int(16, s2Len+1);
    HL = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    FM = parasail_memalign_int(16, s2Len+1);
    FS = parasail_memalign_int(16, s2Len+1);
    FL = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!HM) return NULL;
    if (!HS) return NULL;
    if (!HL) return NULL;
    if (!F) return NULL;
    if (!FM) return NULL;
    if (!FS) return NULL;
    if (!FL) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    HM[0] = 0;
    HS[0] = 0;
    HL[0] = 0;
    F[0] = NEG_INF_32;
    FM[0] = 0;
    FS[0] = 0;
    FL[0] = 0;
    
    /* first row */
    if (s2_beg) {
        for (j=1; j<=s2Len; ++j) {
            H[j] = 0;
            HM[j] = 0;
            HS[j] = 0;
            HL[j] = 0;
            F[j] = NEG_INF_32;
            FM[j] = 0;
            FS[j] = 0;
            FL[j] = 0;
        }
    }
    else {
        for (j=1; j<=s2Len; ++j) {
            H[j] = -open -(j-1)*gap;
            HM[j] = 0;
            HS[j] = 0;
            HL[j] = 0;
            F[j] = NEG_INF_32;
            FM[j] = 0;
            FS[j] = 0;
            FL[j] = 0;
        }
    }


    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int NHM = HM[0];
        int NHS = HS[0];
        int NHL = HL[0];
        int WH = s1_beg ? 0 : (-open - (i-1)*gap);
        int WHM = 0;
        int WHS = 0;
        int WHL = 0;
        int E = NEG_INF_32;
        int EM = 0;
        int ES = 0;
        int EL = 0;
        H[0] = WH;
        HM[0] = WHM;
        HS[0] = WHS;
        HL[0] = WHL;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            int NWM = NHM;
            int NWS = NHS;
            int NWL = NHL;
            NH = H[j];
            NHM = HM[j];
            NHS = HS[j];
            NHL = HL[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            if (F_opn > F_ext) {
                FM[j] = NHM;
                FS[j] = NHS;
                FL[j] = NHL;
            }
            FL[j] += 1;
            if (E_opn > E_ext) {
                EM = WHM;
                ES = WHS;
                EL = WHL;
            }
            EL += 1;
            if (WH == H_dag) {
                WHM  = NWM + (s1[i-1] == s2[j-1]);
                WHS  = NWS + (matrow[s2[j-1]] > 0);
                WHL  = NWL + 1;
            }
            else if (WH == F[j]) {
                WHM  = FM[j];
                WHS  = FS[j];
                WHL  = FL[j];
            }
            else {
                WHM  = EM;
                WHS  = ES;
                WHL  = EL;
            }
            H[j] = WH;
            HM[j] = WHM;
            HS[j] = WHS;
            HL[j] = WHL;
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
            result->stats->tables->matches_table[1LL*(i-1)*s2Len + (j-1)] = WHM;
            result->stats->tables->similar_table[1LL*(i-1)*s2Len + (j-1)] = WHS;
            result->stats->tables->length_table[1LL*(i-1)*s2Len + (j-1)] = WHL;
#endif
        }
        if (s1_end && WH > score) {
            score = WH;
            matches = WHM;
            similar = WHS;
            length = WHL;
            end_query = i-1;
            end_ref = s2Len-1;
        }
#ifdef PARASAIL_ROWCOL
        result->stats->rowcols->score_col[i-1] = WH;
        result->stats->rowcols->matches_col[i-1] = WHM;
        result->stats->rowcols->similar_col[i-1] = WHS;
        result->stats->rowcols->length_col[i-1] = WHL;
#endif
    }
    if (s1_end && s2_end) {
        for (j=1; j<=s2Len; ++j) {
            i = s1Len;
            if (H[j] > score) {
                score = H[j];
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == H[j] && j-1 < end_ref) {
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
        }
    }
    else if (s2_end) {
        for (j=1; j<=s2Len; ++j) {
            i = s1Len;
            if (H[j] > score) {
                score = H[j];
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
        }
    }
    if (!s1_end && !s2_end) {
        score = H[s2Len];
        matches = HM[s2Len];
        similar = HS[s2Len];
        length = HL[s2Len];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->stats->rowcols->score_row[j-1] = H[j];
        result->stats->rowcols->matches_row[j-1] = HM[j];
        result->stats->rowcols->similar_row[j-1] = HS[j];
        result->stats->rowcols->length_row[j-1] = HL[j];
    }
#endif

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(FL);
    parasail_free(FS);
    parasail_free(FM);
    parasail_free(F);
    parasail_free(HL);
    parasail_free(HS);
    parasail_free(HM);
    parasail_free(H);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}